

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplay.h
# Opt level: O0

void highs_splay_unlink<presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
               (HighsInt unlinknode,HighsInt *root,anon_class_8_1_8991fb9c *get_left,
               anon_class_8_1_8991fb9c *get_right,anon_class_8_1_8991fb9c *get_key)

{
  value_type vVar1;
  HighsInt HVar2;
  value_type vVar3;
  HighsInt *pHVar4;
  anon_class_8_1_8991fb9c *in_RCX;
  HighsInt *in_RDX;
  int *in_RSI;
  int in_EDI;
  anon_class_8_1_8991fb9c *in_R8;
  int *in_stack_00000038;
  HighsInt in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  vVar1 = presolve::HPresolve::unlink::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  HVar2 = highs_splay<int,presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
                    (in_stack_00000038,unlinknode,(anon_class_8_1_8991fb9c *)root,get_left,get_right
                    );
  *in_RSI = HVar2;
  if (*in_RSI == in_EDI) {
    pHVar4 = presolve::HPresolve::unlink::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)CONCAT44(vVar1,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    if (*pHVar4 == -1) {
      pHVar4 = presolve::HPresolve::unlink::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)CONCAT44(vVar1,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      *in_RSI = *pHVar4;
    }
    else {
      vVar3 = presolve::HPresolve::unlink::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)CONCAT44(vVar1,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
      presolve::HPresolve::unlink::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)CONCAT44(vVar1,vVar3),in_stack_ffffffffffffffcc);
      HVar2 = highs_splay<int,presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
                        (in_stack_00000038,unlinknode,(anon_class_8_1_8991fb9c *)root,get_left,
                         get_right);
      *in_RSI = HVar2;
      pHVar4 = presolve::HPresolve::unlink::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)CONCAT44(vVar1,vVar3),in_stack_ffffffffffffffcc
                         );
      HVar2 = *pHVar4;
      pHVar4 = presolve::HPresolve::unlink::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)CONCAT44(vVar1,vVar3),in_stack_ffffffffffffffcc
                         );
      *pHVar4 = HVar2;
    }
  }
  else {
    presolve::HPresolve::unlink::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)CONCAT44(vVar1,in_stack_ffffffffffffffd0),in_EDI);
    highs_splay_unlink<presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
              ((HighsInt)((ulong)in_RSI >> 0x20),in_RDX,in_RCX,in_R8,
               (anon_class_8_1_8991fb9c *)CONCAT44(vVar1,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void highs_splay_unlink(HighsInt unlinknode, HighsInt& root, GetLeft&& get_left,
                        GetRight&& get_right, GetKey&& get_key) {
  assert(root != -1);
  root = highs_splay(get_key(unlinknode), root, get_left, get_right, get_key);
  assert(get_key(root) == get_key(unlinknode));

  // in case keys can be equal it might happen that we did not splay the correct
  // node to the top since equal keys are put to the right subtree, we recurse
  // into that part of the tree
  if (root != unlinknode) {
    highs_splay_unlink(unlinknode, get_right(root), get_left, get_right,
                       get_key);
    return;
  }

  assert(root == unlinknode);

  if (get_left(unlinknode) == -1) {
    root = get_right(unlinknode);
  } else {
    root = highs_splay(get_key(unlinknode), get_left(unlinknode), get_left,
                       get_right, get_key);
    get_right(root) = get_right(unlinknode);
  }
}